

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O1

int CommandLineTestRunner::RunAllTests(int ac,char **av)

{
  int iVar1;
  TestRegistry *pTVar2;
  char *s;
  CommandLineTestRunner runner;
  ConsoleTestOutput backupOutput;
  MemoryLeakWarningPlugin memLeakWarn;
  CommandLineTestRunner local_a0;
  TestOutput local_80;
  MemoryLeakWarningPlugin local_60;
  
  TestOutput::TestOutput(&local_80);
  local_80._vptr_TestOutput = (_func_int **)&PTR__TestOutput_0012e160;
  SimpleString::SimpleString((SimpleString *)&local_a0,"MemoryLeakPlugin");
  MemoryLeakWarningPlugin::MemoryLeakWarningPlugin
            (&local_60,(SimpleString *)&local_a0,(MemoryLeakDetector *)0x0);
  SimpleString::~SimpleString((SimpleString *)&local_a0);
  MemoryLeakWarningPlugin::destroyGlobalDetectorAndTurnOffMemoryLeakDetectionInDestructor
            (&local_60,true);
  pTVar2 = TestRegistry::getCurrentRegistry();
  (*pTVar2->_vptr_TestRegistry[0xd])(pTVar2,&local_60);
  pTVar2 = TestRegistry::getCurrentRegistry();
  CommandLineTestRunner(&local_a0,ac,av,pTVar2);
  iVar1 = runAllTestsMain(&local_a0);
  local_a0._vptr_CommandLineTestRunner = (_func_int **)&PTR__CommandLineTestRunner_0012d0b0;
  if (local_a0.arguments_ != (CommandLineArguments *)0x0) {
    (*(local_a0.arguments_)->_vptr_CommandLineArguments[1])();
  }
  if (local_a0.output_ != (TestOutput *)0x0) {
    (*(local_a0.output_)->_vptr_TestOutput[1])();
  }
  if (iVar1 == 0) {
    s = MemoryLeakWarningPlugin::FinalReport(&local_60,0);
    operator<<(&local_80,s);
  }
  pTVar2 = TestRegistry::getCurrentRegistry();
  SimpleString::SimpleString((SimpleString *)&local_a0,"MemoryLeakPlugin");
  (*pTVar2->_vptr_TestRegistry[0x11])(pTVar2,&local_a0);
  SimpleString::~SimpleString((SimpleString *)&local_a0);
  MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin(&local_60);
  TestOutput::~TestOutput(&local_80);
  return iVar1;
}

Assistant:

int CommandLineTestRunner::RunAllTests(int ac, const char *const *av)
{
    int result = 0;
    ConsoleTestOutput backupOutput;

    MemoryLeakWarningPlugin memLeakWarn(DEF_PLUGIN_MEM_LEAK);
    memLeakWarn.destroyGlobalDetectorAndTurnOffMemoryLeakDetectionInDestructor(true);
    TestRegistry::getCurrentRegistry()->installPlugin(&memLeakWarn);

    {
        CommandLineTestRunner runner(ac, av, TestRegistry::getCurrentRegistry());
        result = runner.runAllTestsMain();
    }

    if (result == 0) {
        backupOutput << memLeakWarn.FinalReport(0);
    }
    TestRegistry::getCurrentRegistry()->removePluginByName(DEF_PLUGIN_MEM_LEAK);
    return result;
}